

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  double *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double in_XMM0_Qa;
  ImVec2 IVar12;
  double in_XMM1_Qa;
  undefined8 *in_stack_00000008;
  float grab_pos;
  float grab_t;
  double v_new_1;
  float new_clicked_t;
  double v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  double v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_logarithmic;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  double local_108;
  bool local_f9;
  undefined8 local_f8;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ImGuiInputReadMode in_stack_ffffffffffffff18;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff1c;
  undefined8 local_e0;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  float local_d0;
  float in_stack_ffffffffffffff34;
  ImVec2 in_stack_ffffffffffffff38;
  double local_c0;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined1 is_logarithmic_00;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  byte in_stack_ffffffffffffff7e;
  byte bVar13;
  int in_stack_ffffffffffffff80;
  float local_5c;
  
  pIVar1 = GImGui;
  is_logarithmic_00 = (undefined1)((uint)in_stack_ffffffffffffff64 >> 0x18);
  uVar3 = (uint)((in_R9D & 0x100000) != 0);
  bVar5 = in_EDX == 8;
  bVar6 = in_EDX == 9;
  local_f9 = bVar5 || bVar6;
  bVar2 = false;
  if ((in_R9D & 0x20) != 0) {
    bVar2 = local_f9;
  }
  fVar7 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar8 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar7 = (fVar7 - fVar8) - 4.0;
  local_5c = (pIVar1->Style).GrabMinSize;
  if (in_XMM1_Qa <= in_XMM0_Qa) {
    local_108 = in_XMM0_Qa - in_XMM1_Qa;
  }
  else {
    local_108 = in_XMM1_Qa - in_XMM0_Qa;
  }
  if ((!bVar5 && !bVar6) && (0.0 <= local_108)) {
    local_5c = ImMax<float>((float)((double)fVar7 / (local_108 + 1.0)),(pIVar1->Style).GrabMinSize);
  }
  fVar8 = ImMin<float>(local_5c,fVar7);
  fVar9 = fVar7 - fVar8;
  fVar10 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar10 = fVar8 * 0.5 + fVar10 + 2.0;
  fVar11 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  if (bVar2) {
    if (bVar5 || bVar6) {
      in_stack_fffffffffffffef4 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                      (int)in_stack_fffffffffffffee4);
    }
    else {
      in_stack_fffffffffffffef4 = 1;
    }
    in_stack_ffffffffffffff80 = in_stack_fffffffffffffef4;
    ImPow(0.0,2.519198e-39);
    in_stack_fffffffffffffef0 = (pIVar1->Style).LogSliderDeadzone * 0.5;
    ImMax<float>(fVar9,1.0);
  }
  bVar13 = 0;
  if (pIVar1->ActiveId != in_ESI) goto LAB_001b75b2;
  in_stack_ffffffffffffff7e = 0;
  in_stack_ffffffffffffff78 = 0.0;
  if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
    if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
      ClearActiveID();
    }
    else {
      pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
      in_stack_ffffffffffffff74 = *pfVar4;
      if (fVar9 <= 0.0) {
        in_stack_fffffffffffffeec = 0.0;
      }
      else {
        in_stack_fffffffffffffeec =
             ImClamp<float>((in_stack_ffffffffffffff74 - fVar10) / fVar9,0.0,1.0);
      }
      in_stack_ffffffffffffff78 = in_stack_fffffffffffffeec;
      if (uVar3 == 1) {
        in_stack_ffffffffffffff78 = 1.0 - in_stack_fffffffffffffeec;
      }
      in_stack_ffffffffffffff7e = 1;
    }
  }
  else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
      pIVar1->SliderCurrentAccum = 0.0;
      pIVar1->SliderCurrentAccumDirty = false;
    }
    IVar12 = GetNavInputAmount2d(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                                 in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff6c = IVar12.x;
    in_stack_ffffffffffffff70 = IVar12.y;
    in_stack_fffffffffffffee8 = in_stack_ffffffffffffff6c;
    if (uVar3 != 0) {
      in_stack_fffffffffffffee8 = -in_stack_ffffffffffffff70;
    }
    if ((in_stack_fffffffffffffee8 != 0.0) ||
       (in_stack_ffffffffffffff68 = in_stack_fffffffffffffee8, NAN(in_stack_fffffffffffffee8))) {
      in_stack_ffffffffffffff68 = in_stack_fffffffffffffee8;
      if (bVar5 || bVar6) {
        in_stack_fffffffffffffee4 =
             (float)ImParseFormatPrecision
                              ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                               ,(int)in_stack_fffffffffffffee4);
      }
      else {
        in_stack_fffffffffffffee4 = 0.0;
      }
      if ((int)in_stack_fffffffffffffee4 < 1) {
        fVar9 = in_stack_fffffffffffffee4;
        if ((local_108 < -100.0) || (100.0 < local_108)) {
          bVar2 = IsNavInputDown(0xe);
          is_logarithmic_00 = (undefined1)((uint)fVar9 >> 0x18);
          if (!bVar2) {
            in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 / 100.0;
            goto LAB_001b71ea;
          }
        }
        is_logarithmic_00 = (undefined1)((uint)fVar9 >> 0x18);
        in_stack_ffffffffffffff68 =
             (float)(~-(uint)(in_stack_ffffffffffffff68 < 0.0) & 0x3f800000 |
                    -(uint)(in_stack_ffffffffffffff68 < 0.0) & 0xbf800000) / (float)local_108;
      }
      else {
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 / 100.0;
        fVar9 = in_stack_fffffffffffffee4;
        bVar2 = IsNavInputDown(0xe);
        is_logarithmic_00 = (undefined1)((uint)fVar9 >> 0x18);
        if (bVar2) {
          in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 / 10.0;
        }
      }
LAB_001b71ea:
      bVar2 = IsNavInputDown(0xf);
      if (bVar2) {
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 * 10.0;
      }
      pIVar1->SliderCurrentAccum = in_stack_ffffffffffffff68 + pIVar1->SliderCurrentAccum;
      pIVar1->SliderCurrentAccumDirty = true;
    }
    in_stack_ffffffffffffff60 = pIVar1->SliderCurrentAccum;
    if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0)) {
      ClearActiveID();
    }
    else if ((pIVar1->SliderCurrentAccumDirty & 1U) != 0) {
      in_stack_ffffffffffffff78 =
           ScaleRatioFromValueT<double,double,double>
                     (in_stack_ffffffffffffff80,
                      (double)CONCAT17(bVar13,CONCAT16(in_stack_ffffffffffffff7e,
                                                       CONCAT24(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78))),
                      (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (bool)is_logarithmic_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      if (((1.0 <= in_stack_ffffffffffffff78) && (0.0 < in_stack_ffffffffffffff60)) ||
         ((in_stack_ffffffffffffff78 <= 0.0 && (in_stack_ffffffffffffff60 < 0.0)))) {
        in_stack_ffffffffffffff7e = 0;
        pIVar1->SliderCurrentAccum = 0.0;
      }
      else {
        in_stack_ffffffffffffff7e = 1;
        fVar9 = ImSaturate(in_stack_ffffffffffffff78 + in_stack_ffffffffffffff60);
        ScaleValueFromRatioT<double,double,double>
                  (CONCAT13(bVar13,CONCAT12(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c)),
                   fVar9,(double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (bool)is_logarithmic_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff5c = in_stack_ffffffffffffff78;
        if ((in_R9D & 0x40) == 0) {
          RoundScalarWithFormatT<double,double>
                    ((char *)in_stack_ffffffffffffff38,(ImGuiDataType)in_stack_ffffffffffffff34,
                     (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          in_stack_ffffffffffffff5c = in_stack_ffffffffffffff78;
        }
        in_stack_ffffffffffffff78 = fVar9;
        fVar9 = ScaleRatioFromValueT<double,double,double>
                          (in_stack_ffffffffffffff80,
                           (double)CONCAT17(bVar13,CONCAT16(in_stack_ffffffffffffff7e,
                                                            CONCAT24(in_stack_ffffffffffffff7c,
                                                                     in_stack_ffffffffffffff78))),
                           (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           (bool)is_logarithmic_00,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff5c);
        if (in_stack_ffffffffffffff60 <= 0.0) {
          fVar9 = ImMax<float>(fVar9 - in_stack_ffffffffffffff5c,in_stack_ffffffffffffff60);
          pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar9;
        }
        else {
          fVar9 = ImMin<float>(fVar9 - in_stack_ffffffffffffff5c,in_stack_ffffffffffffff60);
          pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar9;
        }
      }
      pIVar1->SliderCurrentAccumDirty = false;
    }
  }
  if ((in_stack_ffffffffffffff7e & 1) != 0) {
    local_c0 = ScaleValueFromRatioT<double,double,double>
                         (CONCAT13(bVar13,CONCAT12(in_stack_ffffffffffffff7e,
                                                   in_stack_ffffffffffffff7c)),
                          in_stack_ffffffffffffff78,
                          (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (bool)is_logarithmic_00,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff5c);
    if ((in_R9D & 0x40) == 0) {
      local_c0 = RoundScalarWithFormatT<double,double>
                           ((char *)in_stack_ffffffffffffff38,
                            (ImGuiDataType)in_stack_ffffffffffffff34,
                            (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    if ((*in_RCX != local_c0) || (NAN(*in_RCX) || NAN(local_c0))) {
      *in_RCX = local_c0;
      bVar13 = 1;
    }
  }
LAB_001b75b2:
  if (1.0 <= fVar7) {
    fVar7 = ScaleRatioFromValueT<double,double,double>
                      (in_stack_ffffffffffffff80,
                       (double)CONCAT17(bVar13,CONCAT16(in_stack_ffffffffffffff7e,
                                                        CONCAT24(in_stack_ffffffffffffff7c,
                                                                 in_stack_ffffffffffffff78))),
                       (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (bool)is_logarithmic_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    if (uVar3 == 1) {
      fVar7 = 1.0 - fVar7;
    }
    ImLerp<float>(fVar10,-fVar8 * 0.5 + (fVar11 - 2.0),fVar7);
    if (uVar3 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0);
      *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
      in_stack_00000008[1] = local_e0;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0);
      *in_stack_00000008 = local_f8;
      in_stack_00000008[1] = CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_d0,in_RDI,in_RDI);
    *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff34,local_d0);
    *(ImVec2 *)(in_stack_00000008 + 1) = in_stack_ffffffffffffff38;
  }
  return (bool)(bVar13 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}